

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O0

bool __thiscall soplex::SPxSolverBase<double>::terminate(SPxSolverBase<double> *this)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  Verbosity VVar4;
  Pricing PVar5;
  SPxStatus SVar6;
  Representation RVar7;
  uint uVar8;
  SPxSense SVar9;
  double *pdVar10;
  element_type *peVar11;
  SPxSolverBase<double> *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar12;
  Real RVar13;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  SPxOut *_spxout;
  double extraout_XMM0_Qa_05;
  SPxSolverBase<double> *unaff_retaddr;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  int redo;
  _func_ostream_ptr_ostream_ptr *in_stack_ffffffffffffff58;
  SPxOut *in_stack_ffffffffffffff60;
  VectorBase<double> *in_stack_ffffffffffffff68;
  SPxSolverBase<double> *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff80;
  undefined1 forceCheck;
  SPxSolverBase<double> *in_stack_ffffffffffffff88;
  Type local_44;
  Representation local_40;
  SPxSense local_3c;
  double local_38;
  undefined4 local_2c;
  Verbosity local_28 [2];
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  Verbosity local_18;
  int local_14;
  bool local_1;
  
  forceCheck = (undefined1)((ulong)in_stack_ffffffffffffff80 >> 0x38);
  local_14 = dim((SPxSolverBase<double> *)0x24eb61);
  if (local_14 < 1000) {
    local_14 = 1000;
  }
  iVar2 = SPxBasisBase<double>::iteration(&in_RDI->super_SPxBasisBase<double>);
  if ((10 < iVar2) &&
     (iVar2 = SPxBasisBase<double>::iteration(&in_RDI->super_SPxBasisBase<double>),
     iVar2 % local_14 == 0)) {
    TVar3 = type(in_RDI);
    if (TVar3 == ENTER) {
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7c])();
    }
    else {
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7d])();
    }
    computeFrhs(unaff_retaddr);
    if (1 < (in_RDI->super_SPxBasisBase<double>).updateCount) {
      if ((in_RDI->spxout != (SPxOut *)0x0) &&
         (VVar4 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar4)) {
        local_18 = SPxOut::getVerbosity(in_RDI->spxout);
        in_stack_ffffffffffffffe4 = 5;
        (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&stack0xffffffffffffffe4);
        soplex::operator<<(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
        soplex::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_18);
      }
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x75])();
    }
    SPxBasisBase<double>::coSolve
              ((SPxBasisBase<double> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (VectorBase<double> *)in_stack_ffffffffffffff60);
    SPxBasisBase<double>::solve
              ((SPxBasisBase<double> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (VectorBase<double> *)in_stack_ffffffffffffff60);
    PVar5 = pricing(in_RDI);
    if (PVar5 == FULL) {
      computePvec(in_stack_ffffffffffffff70);
      TVar3 = type(in_RDI);
      if (TVar3 == ENTER) {
        computeCoTest((SPxSolverBase<double> *)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
        computeTest((SPxSolverBase<double> *)
                    CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      }
    }
    (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6d])();
    if (0.0 < extraout_XMM0_Qa) {
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6e])();
    }
  }
  SVar6 = SPxBasisBase<double>::status(&in_RDI->super_SPxBasisBase<double>);
  if ((SVar6 < OPTIMAL) &&
     (SVar6 = SPxBasisBase<double>::status(&in_RDI->super_SPxBasisBase<double>),
     (uint)SVar6 < 0x80000000)) {
    bVar1 = isTimeLimitReached(in_stack_ffffffffffffff88,(bool)forceCheck);
    if (bVar1) {
      if ((in_RDI->spxout != (SPxOut *)0x0) &&
         (VVar4 = SPxOut::getVerbosity(in_RDI->spxout), 3 < (int)VVar4)) {
        SPxOut::getVerbosity(in_RDI->spxout);
        local_28[1] = 4;
        (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,local_28 + 1);
        soplex::operator<<(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
        soplex::operator<<(in_stack_ffffffffffffff60,(double)in_stack_ffffffffffffff58);
        soplex::operator<<(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
        soplex::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&stack0xffffffffffffffe0);
      }
      in_RDI->m_status = ABORT_TIME;
      local_1 = true;
    }
    else {
      dVar12 = in_RDI->objLimit;
      pdVar10 = (double *)infinity();
      if (dVar12 < *pdVar10) {
        TVar3 = type(in_RDI);
        RVar7 = rep(in_RDI);
        if (0 < TVar3 * RVar7) {
          (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6d])();
          dVar12 = epsilon((SPxSolverBase<double> *)0x24ef37);
          if (extraout_XMM0_Qa_00 < dVar12) {
            tolerances(in_RDI);
            peVar11 = std::
                      __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x24ef59);
            RVar13 = Tolerances::floatingPointOpttol(peVar11);
            (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6d])();
            uVar8 = (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                      super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                      _vptr_ClassArray[0x74])(RVar13 - extraout_XMM0_Qa_01);
            if ((uVar8 & 1) != 0) {
              SVar9 = SPxLPBase<double>::spxSense(&in_RDI->super_SPxLPBase<double>);
              dVar12 = (double)SVar9;
              (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>
                .super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x5e])();
              dVar12 = dVar12 * extraout_XMM0_Qa_02;
              SVar9 = SPxLPBase<double>::spxSense(&in_RDI->super_SPxLPBase<double>);
              if (dVar12 <= (double)SVar9 * in_RDI->objLimit) {
                (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                  super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                  _vptr_ClassArray[0x5f])();
                (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                  super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                  _vptr_ClassArray[0x6d])();
                dVar12 = epsilon((SPxSolverBase<double> *)0x24f027);
                if (extraout_XMM0_Qa_03 < dVar12) {
                  tolerances(in_RDI);
                  peVar11 = std::
                            __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x24f049);
                  RVar13 = Tolerances::floatingPointOpttol(peVar11);
                  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                    super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                    _vptr_ClassArray[0x6d])();
                  uVar8 = (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                            super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                            _vptr_ClassArray[0x74])(RVar13 - extraout_XMM0_Qa_04);
                  if ((uVar8 & 1) != 0) {
                    SVar9 = SPxLPBase<double>::spxSense(&in_RDI->super_SPxLPBase<double>);
                    _spxout = (SPxOut *)(double)SVar9;
                    (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                      super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                      _vptr_ClassArray[0x5e])();
                    dVar12 = (double)_spxout * extraout_XMM0_Qa_05;
                    SVar9 = SPxLPBase<double>::spxSense(&in_RDI->super_SPxLPBase<double>);
                    if (dVar12 <= (double)SVar9 * in_RDI->objLimit) {
                      if ((in_RDI->spxout != (SPxOut *)0x0) &&
                         (VVar4 = SPxOut::getVerbosity(in_RDI->spxout), 3 < (int)VVar4)) {
                        local_28[0] = SPxOut::getVerbosity(in_RDI->spxout);
                        local_2c = 4;
                        (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_2c);
                        soplex::operator<<(_spxout,(char *)in_stack_ffffffffffffff58);
                        soplex::operator<<(_spxout,(double)in_stack_ffffffffffffff58);
                        soplex::operator<<(_spxout,(char *)in_stack_ffffffffffffff58);
                        soplex::operator<<(_spxout,in_stack_ffffffffffffff58);
                        (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,local_28);
                      }
                      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                        super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                        _vptr_ClassArray[0x5e])();
                      SPxOut::
                      debug<soplex::SPxSolverBase<double>,_const_char_(&)[57],_double,_double_&,_0>
                                (in_RDI,(char (*) [57])
                                        " --- objective value limit reached\n (value:{} limit:{})\n"
                                 ,&local_38,&in_RDI->objLimit);
                      local_3c = SPxLPBase<double>::spxSense(&in_RDI->super_SPxLPBase<double>);
                      local_40 = rep(in_RDI);
                      local_44 = type(in_RDI);
                      SPxOut::
                      debug<soplex::SPxSolverBase<double>,_const_char_(&)[31],_int,_int,_int,_0>
                                (in_RDI,(char (*) [31])" (spxSense:{} rep:{} type:{})\n",&local_3c,
                                 &local_40,&local_44);
                      in_RDI->m_status = ABORT_VALUE;
                      return true;
                    }
                  }
                }
              }
            }
          }
        }
      }
      (in_RDI->super_SPxBasisBase<double>).lastIterCount =
           (in_RDI->super_SPxBasisBase<double>).iterCount;
      local_1 = false;
    }
  }
  else {
    in_RDI->m_status = UNKNOWN;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SPxSolverBase<R>::terminate()
{
#ifdef ENABLE_ADDITIONAL_CHECKS

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::SINGULAR)
      testVecs();

#endif

   int redo = dim();

   if(redo < 1000)
      redo = 1000;

   if(this->iteration() > 10 && this->iteration() % redo == 0)
   {
#ifdef ENABLE_ADDITIONAL_CHECKS
      VectorBase<R> cr(*theCoPrhs);
      VectorBase<R> fr(*theFrhs);
#endif

      if(type() == ENTER)
         computeEnterCoPrhs();
      else
         computeLeaveCoPrhs();

      computeFrhs();

#ifdef ENABLE_ADDITIONAL_CHECKS
      cr -= *theCoPrhs;
      fr -= *theFrhs;

      if(cr.length() > leavetol())
         SPX_MSG_WARNING((*this->spxout), (*this->spxout) << "WSOLVE50 unexpected change of coPrhs "
                         << cr.length() << std::endl;)
         if(fr.length() > entertol())
            SPX_MSG_WARNING((*this->spxout), (*this->spxout) << "WSOLVE51 unexpected change of   Frhs "
                            << fr.length() << std::endl;)
#endif

            if(this->updateCount > 1)
            {
               SPX_MSG_INFO3((*this->spxout), (*this->spxout) << " --- terminate triggers refactorization"
                             << std::endl;)
               factorize();
            }

      SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
      SPxBasisBase<R>::solve(*theFvec, *theFrhs);

      if(pricing() == FULL)
      {
         computePvec();

         if(type() == ENTER)
         {
            computeCoTest();
            computeTest();
         }
      }

      if(shift() > 0.0)
         unShift();
   }

   // check time limit and objective limit only for non-terminal bases
   if(SPxBasisBase<R>::status() >= SPxBasisBase<R>::OPTIMAL  ||
         SPxBasisBase<R>::status() <= SPxBasisBase<R>::SINGULAR)
   {
      m_status = UNKNOWN;
      return true;
   }

   if(isTimeLimitReached())
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- timelimit (" << maxTime
                    << ") reached" << std::endl;)
      m_status = ABORT_TIME;
      return true;
   }

   // objLimit is set and we are running DUAL:
   // - objLimit is set if objLimit < R(infinity)
   // - DUAL is running if rep() * type() > 0 == DUAL (-1 == PRIMAL)
   //
   // In this case we have given a objective value limit, e.g, through a
   // MIP solver, and we want stop solving the LP if we figure out that the
   // optimal value of the current LP can not be better then this objective
   // limit. More precisely:
   // - MINIMIZATION Problem
   //   We want stop the solving process if
   //   objLimit <= current objective value of the DUAL LP
   // - MAXIMIZATION Problem
   //   We want stop the solving process if
   //   objLimit >= current objective value of the DUAL LP
   if(objLimit < R(infinity) && type() * rep() > 0)
   {
      // We have no bound shifts; therefore, we can trust the current
      // objective value.
      // It might be even possible to use this termination value in case of
      // bound violations (shifting) but in this case it is quite difficult
      // to determine if we already reached the limit.
      if(shift() < epsilon() && noViols(tolerances()->floatingPointOpttol() - shift()))
      {
         // SPxSense::MINIMIZE == -1, so we have sign = 1 on minimizing
         if(int(this->spxSense()) * value() <= int(this->spxSense()) * objLimit)
         {
            // ensure that solution is accurate
            factorizeAndRecompute();

            // check no violations and objective limit again
            if(shift() < epsilon() && noViols(tolerances()->floatingPointOpttol() - shift())
                  && int(this->spxSense()) * value() <= int(this->spxSense()) * objLimit)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- objective value limit (" << objLimit
                             << ") reached" << std::endl;)
               SPxOut::debug(this, " --- objective value limit reached\n (value:{} limit:{})\n", value(),
                             objLimit);
               SPxOut::debug(this, " (spxSense:{} rep:{} type:{})\n", int(this->spxSense()), int(rep()),
                             int(type()));

               m_status = ABORT_VALUE;
               return true;
            }
         }
      }
   }

   this->lastIterCount = this->iterCount;

   return false;
}